

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::LE_Fire_PDU::LE_Fire_PDU(LE_Fire_PDU *this,LE_EntityIdentifier *ID)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  
  LE_Header::LE_Header(&this->super_LE_Header);
  (this->super_LE_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__LE_Fire_PDU_00320968;
  DATA_TYPE::LE_EntityIdentifier::LE_EntityIdentifier(&this->m_TargetID);
  DATA_TYPE::LE_EntityIdentifier::LE_EntityIdentifier(&this->m_MunitionID);
  DATA_TYPE::LE_EntityIdentifier::LE_EntityIdentifier(&this->m_EventID);
  DATA_TYPE::MunitionDescriptor::MunitionDescriptor(&this->m_MunitionDesc);
  DATA_TYPE::RelativeWorldCoordinates::RelativeWorldCoordinates(&this->m_Loc);
  DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>_>::LE_Vector
            (&this->m_Vel);
  this->m_ui16Range = 0;
  KVar1 = ID->m_ui8ApplicationID;
  KVar2 = ID->m_ui16EntityID;
  (this->super_LE_Header).m_EntID.m_ui8SiteID = ID->m_ui8SiteID;
  (this->super_LE_Header).m_EntID.m_ui8ApplicationID = KVar1;
  (this->super_LE_Header).m_EntID.m_ui16EntityID = KVar2;
  (this->m_FireFlagUnion).m_ui8Flag = '\0';
  (this->super_LE_Header).super_Header.super_Header6.m_ui8PDUType = '1';
  (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength = 0x23;
  return;
}

Assistant:

LE_Fire_PDU::LE_Fire_PDU( const LE_EntityIdentifier & ID ) :
    m_ui16Range( 0 )
{
    m_EntID = ID;
    m_FireFlagUnion.m_ui8Flag = 0;
    m_ui8PDUType = LEFire_PDU_Type;
    m_ui16PDULength = LE_FIRE_PDU_SIZE;
}